

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::FederateState::receiveAny(FederateState *this,InterfaceHandle *hid)

{
  bool bVar1;
  const_iterator __lhs;
  BaseType *in_RDX;
  long in_RSI;
  EndpointInfo *in_RDI;
  Time firstTime;
  unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *end_point;
  const_iterator __end1;
  const_iterator __begin1;
  handle *__range1;
  handle elock;
  EndpointInfo *endpointI;
  Time earliest_time;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *result;
  Time in_stack_ffffffffffffff38;
  _Head_base<0UL,_helics::Message_*,_false> _Var2;
  InterfaceHandle local_90;
  InterfaceHandle local_8c;
  undefined8 local_88;
  undefined1 local_7d;
  undefined4 local_7c;
  Time in_stack_ffffffffffffff88;
  Time in_stack_ffffffffffffff90;
  __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
  local_50;
  undefined1 *local_48;
  undefined1 local_40 [24];
  pointer local_28;
  TimeRepresentation<count_time<9,_long>_> local_20;
  BaseType *local_18;
  
  local_20.internalTimeCode = 0x7fffffffffffffff;
  local_28 = (pointer)0x0;
  _Var2._M_head_impl = (Message *)in_RDI;
  local_18 = in_RDX;
  InterfaceInfo::getEndpoints_abi_cxx11_
            ((InterfaceInfo *)in_stack_ffffffffffffff38.internalTimeCode);
  local_48 = local_40;
  local_50._M_current =
       (unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *)
       gmlc::libguarded::
       lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
       ::begin((lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                *)in_stack_ffffffffffffff38.internalTimeCode);
  __lhs = gmlc::libguarded::
          lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
          ::end((lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                 *)in_stack_ffffffffffffff38.internalTimeCode);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                           ((__normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                             *)__lhs._M_current,
                            (__normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                             *)in_stack_ffffffffffffff38.internalTimeCode),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffff90.internalTimeCode =
         (baseType)
         __gnu_cxx::
         __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
         ::operator*(&local_50);
    std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>::operator->
              ((unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *)
               0x5780f9);
    in_stack_ffffffffffffff38 = EndpointInfo::firstMessageTime(in_RDI);
    in_stack_ffffffffffffff88 = in_stack_ffffffffffffff38;
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      ((TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffff88,
                       &local_20);
    if (bVar1) {
      local_20.internalTimeCode = in_stack_ffffffffffffff88.internalTimeCode;
      local_28 = std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>::
                 get(__lhs._M_current);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
    ::operator++(&local_50);
  }
  if (local_28 == (pointer)0x0) {
    std::unique_ptr<helics::Message,std::default_delete<helics::Message>>::
    unique_ptr<std::default_delete<helics::Message>,void>
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               __lhs._M_current,(nullptr_t)in_stack_ffffffffffffff38.internalTimeCode);
  }
  else {
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=
                      (&local_20,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x508));
    if (bVar1) {
      local_7d = 0;
      local_88 = *(undefined8 *)(in_RSI + 0x508);
      EndpointInfo::getMessage
                ((EndpointInfo *)in_stack_ffffffffffffff88.internalTimeCode,
                 in_stack_ffffffffffffff90);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                         0x5781fb);
      if (bVar1) {
        local_8c.hid = (local_28->id).handle.hid;
      }
      else {
        memset(&local_8c,0,4);
        InterfaceHandle::InterfaceHandle(&local_8c);
      }
      *local_18 = local_8c.hid;
      local_7d = 1;
    }
    else {
      memset(&local_90,0,4);
      InterfaceHandle::InterfaceHandle(&local_90);
      *local_18 = local_90.hid;
      std::unique_ptr<helics::Message,std::default_delete<helics::Message>>::
      unique_ptr<std::default_delete<helics::Message>,void>
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 __lhs._M_current,(nullptr_t)in_stack_ffffffffffffff38.internalTimeCode);
    }
  }
  local_7c = 1;
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                  *)0x5782a7);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)_Var2._M_head_impl;
}

Assistant:

std::unique_ptr<Message> FederateState::receiveAny(InterfaceHandle& hid)
{
    Time earliest_time = Time::maxVal();
    EndpointInfo* endpointI = nullptr;
    auto elock = interfaceInformation.getEndpoints();
    // Find the end point with the earliest message time
    for (const auto& end_point : elock) {
        auto firstTime = end_point->firstMessageTime();
        if (firstTime < earliest_time) {
            earliest_time = firstTime;
            endpointI = end_point.get();
        }
    }
    if (endpointI == nullptr) {
        return nullptr;
    }
    // Return the message found and remove from the queue
    if (earliest_time <= time_granted) {
        auto result = endpointI->getMessage(time_granted);
        hid = (result) ? endpointI->id.handle : InterfaceHandle{};

        return result;
    }
    hid = InterfaceHandle();
    return nullptr;
}